

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O2

void __thiscall
miner_tests::MinerTestingSetup::TestBasicMining
          (MinerTestingSetup *this,CScript *scriptPubKey,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txFirst,int baseheight)

{
  int *piVar1;
  FastRandomContext *this_00;
  long lVar2;
  element_type *peVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  ChainstateManager *this_01;
  undefined8 uVar7;
  undefined8 uVar8;
  shared_count sVar9;
  size_type sVar10;
  CTxMemPool *pCVar11;
  CScript *pCVar12;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar13;
  Chainstate *pCVar14;
  CBlockIndex *pCVar15;
  uint256 *puVar16;
  CCoinsViewCache *pCVar17;
  CBlockIndex **ppCVar18;
  int64_t iVar19;
  int64_t iVar20;
  CBlockIndex *pCVar21;
  undefined8 uVar22;
  iterator pvVar23;
  char *pcVar24;
  iterator pvVar25;
  int iVar26;
  long in_FS_OFFSET;
  bool bVar27;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  check_type cVar28;
  CTxMemPool *ar;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  undefined1 local_9f0 [88];
  char *local_998;
  char *local_990;
  __node_base_ptr local_988;
  undefined1 *local_980;
  char *local_978;
  CChainParams *local_970;
  char *local_968;
  Chainstate *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 local_5d8 [88];
  char *local_580;
  char *local_578;
  __node_base_ptr local_570;
  undefined1 *local_568;
  char *local_560;
  CChainParams *local_558;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 local_4f0 [88];
  char *local_498;
  char *local_490;
  __node_base_ptr local_488;
  undefined1 *local_480;
  char *local_478;
  CChainParams *local_470;
  undefined1 local_468 [152];
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 local_3b0 [56];
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  undefined1 *local_370;
  __node_base local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  __node_base_ptr local_348;
  __buckets_ptr local_340;
  undefined1 *local_338;
  char *local_330;
  CTxMemPool *local_328;
  char *local_2f0;
  Chainstate *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 local_2c0 [96];
  duration local_260;
  undefined4 local_258;
  undefined8 local_250;
  undefined1 local_248;
  undefined8 local_244;
  CTxMemPool *local_238;
  Chainstate *pCStack_230;
  CMutableTransaction tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  shared_count asStack_1b8 [2];
  vector<int,_std::allocator<int>_> prevheights;
  CScript script;
  undefined1 local_168 [24];
  char *apcStack_150 [6];
  undefined1 local_120;
  Txid hash;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  CMutableTransaction::CMutableTransaction(&tx);
  local_260.__r = 0;
  local_250._0_4_ = 0;
  local_250._4_4_ = 0;
  local_248 = 0;
  local_244 = 4;
  local_238 = (CTxMemPool *)0x0;
  pCStack_230 = (Chainstate *)0x0;
  local_2c0._88_8_ = 0xb;
  local_258 = 0xb;
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0xe6;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0xe6,false);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&pblocktemplate_1,(CScript *)local_168);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_2c0._72_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_2c0._80_8_ = "";
  local_2c0._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xea;
  file.m_begin = local_2c0 + 0x48;
  msg.m_end = pvVar25;
  msg.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_2c0 + 0x38),
             msg);
  script.super_CScriptBase._union.direct[0] =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
       pblocktemplate_1._M_t.
       super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
       super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  script.super_CScriptBase._union._8_8_ = 0;
  script.super_CScriptBase._union._16_8_ = 0;
  apcStack_150[0] = (char *)&prevheights;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_8bb86f;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb465f;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c0._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_2c0._48_8_ = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&script,(lazy_ostream *)local_168,1,0,WARN,_cVar28,
             (size_t)(local_2c0 + 0x28),0xea);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&script.super_CScriptBase._union + 0x10));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  pCVar12 = CScript::operator<<((CScript *)local_168,OP_0);
  pCVar12 = CScript::operator<<(pCVar12,OP_0);
  pCVar12 = CScript::operator<<(pCVar12,OP_0);
  pCVar12 = CScript::operator<<(pCVar12,OP_NOP);
  pCVar12 = CScript::operator<<(pCVar12,OP_CHECKMULTISIG);
  ppVar13 = &CScript::operator<<(pCVar12,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  peVar3 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 5000000000;
  iVar26 = 0x3e9;
  while (iVar26 != 0) {
    (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue =
         (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start)->nValue + -1000000;
    CMutableTransaction::GetHash((Txid *)local_168,&tx);
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
    local_2c0._88_8_ = 1000000;
    local_260.__r =
         (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
    local_248 = iVar26 == 0x3e9;
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
    CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
    iVar26 = iVar26 + -1;
  }
  local_2c0._24_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_2c0._32_8_ = "";
  local_2c0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xfd;
  file_00.m_begin = local_2c0 + 0x18;
  msg_00.m_end = pvVar25;
  msg_00.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)(local_2c0 + 8),
             msg_00);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_2c0,(CScript *)local_168);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             local_2c0);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xfd;
  file_01.m_begin = (iterator)&local_2d0;
  msg_01.m_end = pvVar25;
  msg_01.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2e0,
             msg_01);
  script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)script.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  script.super_CScriptBase._union._8_8_ = 0;
  script.super_CScriptBase._union._16_8_ = 0;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011489c8;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  apcStack_150[0] = "exception std::runtime_error expected but not raised";
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_2e8 = (Chainstate *)0xbb43f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&script,(lazy_ostream *)local_168,1,1,WARN,_cVar28,
             (size_t)&local_2f0,0xfd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&script.super_CScriptBase._union + 0x10));
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&pblocktemplate_1);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x102;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock12,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x102,false);
  peVar3 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 5000000000;
  iVar26 = 0x3e9;
  while (iVar26 != 0) {
    (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue =
         (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start)->nValue + -1000000;
    CMutableTransaction::GetHash((Txid *)local_168,&tx);
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
    local_2c0._88_8_ = 1000000;
    local_260.__r =
         (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
    local_248 = iVar26 == 0x3e9;
    local_244._0_4_ = 0x50;
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
    CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
    iVar26 = iVar26 + -1;
  }
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_328 = (CTxMemPool *)0xbb43f0;
  local_340 = (__buckets_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x10e;
  file_02.m_begin = (iterator)&local_330;
  msg_02.m_end = pvVar25;
  msg_02.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_340,
             msg_02);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&pblocktemplate_1,(CScript *)local_168);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                            )pblocktemplate_1._M_t.
                             super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
                           (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                            )0x0);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)0xbb50de;
  criticalblock19.super_unique_lock._8_8_ =
       (long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x4a;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &criticalblock19;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_348 = (__node_base_ptr)0xbb43f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&prevheights,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_350,0x10e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&pblocktemplate_1);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x113;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x113,false);
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prevheights,0x208,
             (allocator_type *)local_168);
  iVar26 = 0x12;
  while( true ) {
    bVar27 = iVar26 == 0;
    iVar26 = iVar26 + -1;
    if (bVar27) break;
    pCVar12 = CScript::operator<<(&(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                    .super__Vector_impl_data._M_start)->scriptSig,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &prevheights);
    CScript::operator<<(pCVar12,OP_DROP);
  }
  CScript::operator<<(&(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,OP_1);
  peVar3 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 5000000000;
  iVar26 = 0x80;
  while (iVar26 != 0) {
    (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start)->nValue =
         (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start)->nValue + -1000000;
    CMutableTransaction::GetHash((Txid *)local_168,&tx);
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
    hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
    local_2c0._88_8_ = 1000000;
    local_260.__r =
         (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
    local_248 = iVar26 == 0x80;
    TestMemPoolEntryHelper::FromTx
              ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
    CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
    iVar26 = iVar26 + -1;
  }
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368._M_nxt = (_Hash_node_base *)&boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x126;
  file_03.m_begin = (iterator)&local_360;
  msg_03.m_end = pvVar25;
  msg_03.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_370,
             msg_03);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&pblocktemplate,(CScript *)local_168);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)
       CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,
                (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
                pblocktemplate._M_t.
                super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                ._M_t.
                super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
                0x0);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )((long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x11);
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3b0._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_3b0._48_8_ = "";
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)(local_3b0 + 0x28),0x126);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&pblocktemplate);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prevheights);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x12b;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,299,false);
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 1000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_3b0._24_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_3b0._32_8_ = "";
  local_3b0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x130;
  file_04.m_begin = local_3b0 + 0x18;
  msg_04.m_end = pvVar25;
  msg_04.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)(local_3b0 + 8),
             msg_04);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_3b0,(CScript *)local_168);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             local_3b0);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x130;
  file_05.m_begin = (iterator)&local_3c0;
  msg_05.m_end = pvVar25;
  msg_05.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3d0,
             msg_05);
  script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)script.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  script.super_CScriptBase._union._8_8_ = 0;
  script.super_CScriptBase._union._16_8_ = 0;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011489c8;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  apcStack_150[0] = "exception std::runtime_error expected but not raised";
  local_468._136_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_468._144_8_ = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&script,(lazy_ostream *)local_168,1,1,WARN,_cVar28,
             (size_t)(local_468 + 0x88),0x130);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&script.super_CScriptBase._union + 0x10));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x135;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock12,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x135,false);
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  peVar3 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 4900000000;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 100000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,2);
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  peVar3 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar22 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 0x10);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
   [1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)&(peVar3->hash).m_wrapped;
  *(undefined8 *)
   (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar22;
  *(undefined8 *)
   (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) = uVar7;
  *(undefined8 *)
   (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  [1].prevout.n = 0;
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue =
       (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
       _M_start)->nValue + 4600000000;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 400000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_468._72_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_468._80_8_ = "";
  local_468._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_468._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x145;
  file_06.m_begin = local_468 + 0x48;
  msg_06.m_end = pvVar25;
  msg_06.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
             (size_t)(local_468 + 0x38),msg_06);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&pblocktemplate_1,(CScript *)local_168);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                            )pblocktemplate_1._M_t.
                             super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
                           (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                            )0x0);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)0xbb50de;
  criticalblock19.super_unique_lock._8_8_ =
       (long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x4a;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_468._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_468._48_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
       + 0x5d;
  script.super_CScriptBase._24_8_ = &criticalblock19.super_unique_lock;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&prevheights,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)(local_468 + 0x28),0x145);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&pblocktemplate_1);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x14a;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x14a,false);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
  COutPoint::SetNull(&(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout);
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  pCVar12 = CScript::operator<<((CScript *)local_168,OP_0);
  ppVar13 = &CScript::operator<<(pCVar12,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 1000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 0;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_468._24_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_468._32_8_ = "";
  local_468._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_468._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x155;
  file_07.m_begin = local_468 + 0x18;
  msg_07.m_end = pvVar25;
  msg_07.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)(local_468 + 8),
             msg_07);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_468,(CScript *)local_168);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             local_468);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_470 = (CChainParams *)0xbb43f0;
  local_488 = (__node_base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x155;
  file_08.m_begin = (iterator)&local_478;
  msg_08.m_end = pvVar25;
  msg_08.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_488,
             msg_08);
  script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)script.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  script.super_CScriptBase._union._8_8_ = 0;
  script.super_CScriptBase._union._16_8_ = 0;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011489c8;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  apcStack_150[0] = "exception std::runtime_error expected but not raised";
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_490 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&script,(lazy_ostream *)local_168,1,1,WARN,_cVar28,
             (size_t)&local_498,0x155);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&script.super_CScriptBase._union + 0x10));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x15a;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x15a,false);
  peVar3 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 4900000000;
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 100000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_2)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 100000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_4f0._24_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_4f0._32_8_ = "";
  local_4f0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x166;
  file_09.m_begin = local_4f0 + 0x18;
  msg_09.m_end = pvVar25;
  msg_09.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)(local_4f0 + 8),
             msg_09);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_4f0,(CScript *)local_168);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             local_4f0);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x166;
  file_10.m_begin = (iterator)&local_500;
  msg_10.m_end = pvVar25;
  msg_10.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_510,
             msg_10);
  script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)script.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  script.super_CScriptBase._union._8_8_ = 0;
  script.super_CScriptBase._union._16_8_ = 0;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011489c8;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  apcStack_150[0] = "exception std::runtime_error expected but not raised";
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_518 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&script,(lazy_ostream *)local_168,1,1,WARN,_cVar28,
             (size_t)&local_520,0x166);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&script.super_CScriptBase._union + 0x10));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x16b;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&pblocktemplate_1,&pCVar11->cs,
             "tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x16b,false);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar5 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng;
  while( true ) {
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    if (0x3344e < (pCVar14->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1]->nHeight) break;
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar6 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar6 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar21 = (CBlockIndex *)0x0;
    }
    else {
      pCVar21 = ppCVar6[-1];
    }
    pCVar15 = (CBlockIndex *)operator_new(0x98);
    memset(pCVar15,0,0x98);
    CBlockIndex::CBlockIndex(pCVar15);
    puVar16 = (uint256 *)operator_new(0x20);
    RandomMixin<FastRandomContext>::rand256(puVar16,&this_00->super_RandomMixin<FastRandomContext>);
    pCVar15->phashBlock = puVar16;
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar17 = Chainstate::CoinsTip(pCVar14);
    CBlockIndex::GetBlockHash((uint256 *)local_168,pCVar15);
    CCoinsViewCache::SetBestBlock(pCVar17,(uint256 *)local_168);
    pCVar15->pprev = pCVar21;
    pCVar15->nHeight = pCVar21->nHeight + 1;
    CBlockIndex::BuildSkip(pCVar15);
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    CChain::SetTip(&pCVar14->m_chain,pCVar15);
  }
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_558 = (CChainParams *)0xbb43f0;
  local_570 = (__node_base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x17a;
  file_11.m_begin = (iterator)&local_560;
  msg_11.m_end = pvVar25;
  msg_11.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_570,
             msg_11);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&criticalblock19,(CScript *)local_168);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           criticalblock19.super_unique_lock._M_device != (mutex_type *)0x0);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  criticalblock12.super_unique_lock._M_device = (mutex_type *)0xbb50de;
  criticalblock12.super_unique_lock._8_8_ =
       (long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x4a;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &criticalblock12;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_578 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&prevheights,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_580,0x17a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             &criticalblock19);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  while( true ) {
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    if (209999 < (pCVar14->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->nHeight) break;
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar6 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar6 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar21 = (CBlockIndex *)0x0;
    }
    else {
      pCVar21 = ppCVar6[-1];
    }
    pCVar15 = (CBlockIndex *)operator_new(0x98);
    memset(pCVar15,0,0x98);
    CBlockIndex::CBlockIndex(pCVar15);
    puVar16 = (uint256 *)operator_new(0x20);
    RandomMixin<FastRandomContext>::rand256(puVar16,&this_00->super_RandomMixin<FastRandomContext>);
    pCVar15->phashBlock = puVar16;
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar17 = Chainstate::CoinsTip(pCVar14);
    CBlockIndex::GetBlockHash((uint256 *)local_168,pCVar15);
    CCoinsViewCache::SetBestBlock(pCVar17,(uint256 *)local_168);
    pCVar15->pprev = pCVar21;
    pCVar15->nHeight = pCVar21->nHeight + 1;
    CBlockIndex::BuildSkip(pCVar15);
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    CChain::SetTip(&pCVar14->m_chain,pCVar15);
  }
  local_5d8._72_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_5d8._80_8_ = "";
  local_5d8._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x186;
  file_12.m_begin = local_5d8 + 0x48;
  msg_12.m_end = pvVar25;
  msg_12.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
             (size_t)(local_5d8 + 0x38),msg_12);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&criticalblock19,(CScript *)local_168);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           criticalblock19.super_unique_lock._M_device != (mutex_type *)0x0);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  criticalblock12.super_unique_lock._M_device = (mutex_type *)0xbb50de;
  criticalblock12.super_unique_lock._8_8_ =
       (long)"pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey)" + 0x4a;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &criticalblock12;
  local_5d8._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_5d8._48_8_ = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&prevheights,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)(local_5d8 + 0x28),0x186);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             &criticalblock19);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  peVar3 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 0x129f6afc0;
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_0)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&script.super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  ScriptHash::ScriptHash((ScriptHash *)&criticalblock12,&script);
  sVar9.pi_ = asStack_1b8[0].pi_;
  local_168[0x10] = (uchar)asStack_1b8[0].pi_;
  local_168[0x11] = asStack_1b8[0].pi_._1_1_;
  local_168[0x12] = asStack_1b8[0].pi_._2_1_;
  local_168[0x13] = asStack_1b8[0].pi_._3_1_;
  local_168._0_8_ = criticalblock12.super_unique_lock._M_device;
  local_168._8_8_ = criticalblock12.super_unique_lock._8_8_;
  local_120 = 3;
  asStack_1b8[0].pi_ = sVar9.pi_;
  GetScriptForDestination((CScript *)&prevheights,(CTxDestination *)local_168);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&prevheights);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&prevheights);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_168);
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 1000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  uVar22 = &script;
  sVar10 = script.super_CScriptBase._size;
  if (0x1c < script.super_CScriptBase._size) {
    uVar22 = script.super_CScriptBase._union.indirect_contents.indirect;
    sVar10 = script.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&prevheights,(iterator)uVar22,
             (uchar *)(uVar22 + (long)(int)sVar10),(allocator_type *)&criticalblock12);
  ppVar13 = &CScript::operator<<((CScript *)local_168,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &prevheights)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar13);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prevheights);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue =
       (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
       _M_start)->nValue + -1000000;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 1000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 0;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_5d8._24_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_5d8._32_8_ = "";
  local_5d8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x197;
  file_13.m_begin = local_5d8 + 0x18;
  msg_13.m_end = pvVar25;
  msg_13.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)(local_5d8 + 8),
             msg_13);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_5d8,(CScript *)local_168);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             local_5d8);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x197;
  file_14.m_begin = (iterator)&local_5e8;
  msg_14.m_end = pvVar25;
  msg_14.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5f8,
             msg_14);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011489c8;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  apcStack_150[0] = "exception std::runtime_error expected but not raised";
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_600 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&prevheights,(lazy_ostream *)local_168,1,1,WARN,_cVar28,
             (size_t)&local_608,0x197);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    if ((pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight <
        (int)((ulong)((long)ppCVar4 - (long)ppCVar5) >> 3)) break;
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar6 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar6 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar21 = (CBlockIndex *)0x0;
    }
    else {
      pCVar21 = ppCVar6[-1];
    }
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar18 = inline_assertion_check<true,CBlockIndex*&>
                         (&pCVar21->pprev,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                          ,0x19c,"TestBasicMining","del->pprev");
    CChain::SetTip(&pCVar14->m_chain,*ppCVar18);
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar17 = Chainstate::CoinsTip(pCVar14);
    CBlockIndex::GetBlockHash((uint256 *)local_168,pCVar21->pprev);
    CCoinsViewCache::SetBestBlock(pCVar17,(uint256 *)local_168);
    operator_delete(pCVar21->phashBlock,0x20);
    operator_delete(pCVar21,0x98);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&pblocktemplate_1);
  pCVar11 = MakeMempool(this);
  pvVar23 = (iterator)0x1a4;
  pvVar25 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&pCVar11->cs,"tx_mempool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x1a4,false);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar19 = CBlockIndex::GetMedianTimePast
                     ((pCVar14->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]);
  SetMockTime(iVar19 + 1);
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx.version = 2;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx.vin,1);
  std::vector<int,_std::allocator<int>_>::resize(&prevheights,1);
  peVar3 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  )->nSequence = (pCVar14->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->nHeight + 1;
  *prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = baseheight + 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 4900000000;
  local_168._16_8_ = (CChainParams *)0x0;
  apcStack_150[0] = (char *)0x0;
  local_168._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  local_168._8_8_ = 0;
  ppVar13 = &CScript::operator<<((CScript *)local_168,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar13);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  tx.nLockTime = 0;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_2c0._88_8_ = 100000000;
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_248 = 1;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x1bb;
  file_15.m_begin = (iterator)&local_648;
  msg_15.m_end = pvVar25;
  msg_15.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_658,
             msg_15);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
          )(__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  else {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         *(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
           *)&((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
              (ppCVar4 + -1))->
              super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
    ;
  }
  ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                       ((CBlockIndex **)&pblocktemplate,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                        ,0x1bb,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
  pCVar21 = *ppCVar18;
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = CheckFinalTxAtTip(pCVar21,(CTransaction *)local_168);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb99f;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_660 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_668,0x1bb);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x1bc;
  file_16.m_begin = (iterator)&local_678;
  msg_16.m_end = pvVar25;
  msg_16.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_688,
             msg_16);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,!bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb9b9;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_690 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_698,0x1bc);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar21 = (CBlockIndex *)0x0;
  }
  else {
    pCVar21 = ppCVar4[-1];
  }
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x1c0;
  file_17.m_begin = (iterator)&local_6a8;
  msg_17.m_end = pvVar25;
  msg_17.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_6b8,
             msg_17);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  CreateBlockIndex((miner_tests *)&pblocktemplate,pCVar21->nHeight + 2,pCVar21);
  bVar27 = SequenceLocks((CTransaction *)local_168,1,&prevheights,
                         (CBlockIndex *)
                         pblocktemplate._M_t.
                         super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                         .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb9d1;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_6c0 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_6c8,0x1c0);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  std::unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_>::~unique_ptr
            ((unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_> *)&pblocktemplate);
  CTransaction::~CTransaction((CTransaction *)local_168);
  peVar3 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar19 = CBlockIndex::GetMedianTimePast
                     ((pCVar14->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar20 = CBlockIndex::GetMedianTimePast
                     ((pCVar14->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  )->nSequence = (int)((ulong)((iVar19 + 1) - iVar20) >> 9) + 1U | 0x400000;
  *prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = baseheight + 2;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x1c9;
  file_18.m_begin = (iterator)&local_6d8;
  msg_18.m_end = pvVar25;
  msg_18.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6e8,
             msg_18);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
          )(__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  else {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         *(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
           *)&((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
              (ppCVar4 + -1))->
              super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
    ;
  }
  ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                       ((CBlockIndex **)&pblocktemplate,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                        ,0x1c9,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
  pCVar21 = *ppCVar18;
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = CheckFinalTxAtTip(pCVar21,(CTransaction *)local_168);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb9e9;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_6f0 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_6f8,0x1c9);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x1ca;
  file_19.m_begin = (iterator)&local_708;
  msg_19.m_end = pvVar25;
  msg_19.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_718,
             msg_19);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,!bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb9b9;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_720 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_728,0x1ca);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  for (iVar26 = 0;
      this_01 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                chainman._M_t.
                super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                _M_t.
                super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl, iVar26 != -0xb;
      iVar26 = iVar26 + -1) {
    pCVar14 = ChainstateManager::ActiveChainstate(this_01);
    ppCVar4 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar4 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar21 = (CBlockIndex *)0x0;
    }
    else {
      pCVar21 = ppCVar4[-1];
    }
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar21 = CBlockIndex::GetAncestor
                        (pCVar21,(pCVar14->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight + iVar26);
    pCVar21->nTime = pCVar21->nTime + 0x200;
  }
  pCVar14 = ChainstateManager::ActiveChainstate(this_01);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar21 = (CBlockIndex *)0x0;
  }
  else {
    pCVar21 = ppCVar4[-1];
  }
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x1d1;
  file_20.m_begin = (iterator)&local_738;
  msg_20.m_end = pvVar25;
  msg_20.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_748,
             msg_20);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  CreateBlockIndex((miner_tests *)&pblocktemplate,pCVar21->nHeight + 1,pCVar21);
  bVar27 = SequenceLocks((CTransaction *)local_168,1,&prevheights,
                         (CBlockIndex *)
                         pblocktemplate._M_t.
                         super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                         .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb9f5;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_750 = "";
  pcVar24 = &DAT_00000001;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_758,0x1d1);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  std::unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_>::~unique_ptr
            ((unique_ptr<CBlockIndex,_std::default_delete<CBlockIndex>_> *)&pblocktemplate);
  CTransaction::~CTransaction((CTransaction *)local_168);
  for (iVar26 = 0; iVar26 != -0xb; iVar26 = iVar26 + -1) {
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar4 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar4 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar21 = (CBlockIndex *)0x0;
    }
    else {
      pCVar21 = ppCVar4[-1];
    }
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    local_168._0_8_ =
         CBlockIndex::GetAncestor
                   (pCVar21,(pCVar14->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight + iVar26);
    pcVar24 = 
    "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
    ;
    ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                         ((CBlockIndex **)local_168,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                          ,0x1d5,"TestBasicMining",
                          "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
                         );
    (*ppCVar18)->nTime = (*ppCVar18)->nTime - 0x200;
  }
  peVar3 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  )->nSequence = 0xfffffffe;
  *prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = baseheight + 3;
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  tx.nLockTime = (pCVar14->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->nHeight + 1;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x1e0;
  file_21.m_begin = (iterator)&local_768;
  msg_21.m_end = pvVar23;
  msg_21.m_begin = pcVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_778,
             msg_21);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
          )(__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  else {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         *(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
           *)&((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
              (ppCVar4 + -1))->
              super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
    ;
  }
  ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                       ((CBlockIndex **)&pblocktemplate,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                        ,0x1e0,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
  pCVar21 = *ppCVar18;
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = CheckFinalTxAtTip(pCVar21,(CTransaction *)local_168);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,!bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bba19;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_780 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_788,0x1e0);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x1e1;
  file_22.m_begin = (iterator)&local_798;
  msg_22.m_end = pvVar25;
  msg_22.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_7a8,
             msg_22);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )((long)"!TestSequenceLocks(CTransaction{tx}, tx_mempool)" + 1);
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_7b0 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_7b8,0x1e1);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x1e2;
  file_23.m_begin = (iterator)&local_7c8;
  msg_23.m_end = pvVar25;
  msg_23.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_7d8,
             msg_23);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar26 = (pCVar14->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->nHeight;
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar19 = CBlockIndex::GetMedianTimePast
                     ((pCVar14->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]);
  bVar27 = IsFinalTx((CTransaction *)local_168,iVar26 + 2,iVar19);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bba4b;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_7e0 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_7e8,0x1e2);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  peVar3 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar22 = *(undefined8 *)&(peVar3->hash).m_wrapped;
  uVar7 = *(undefined8 *)((long)&peVar3->hash + 8);
  uVar8 = *(undefined8 *)((long)&peVar3->hash + 0x18);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar22;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar19 = CBlockIndex::GetMedianTimePast
                     ((pCVar14->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]);
  tx.nLockTime = (uint32_t)iVar19;
  std::vector<int,_std::allocator<int>_>::resize(&prevheights,1);
  *prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = baseheight + 4;
  CMutableTransaction::GetHash((Txid *)local_168,&tx);
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = apcStack_150[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
  hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
  local_260.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)(local_2c0 + 0x58),&tx);
  CTxMemPool::addUnchecked(pCVar11,(CTxMemPoolEntry *)local_168);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_168);
  local_7f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x1eb;
  file_24.m_begin = (iterator)&local_7f8;
  msg_24.m_end = pvVar25;
  msg_24.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_808,
             msg_24);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
          )(__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  else {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         *(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
           *)&((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
              (ppCVar4 + -1))->
              super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
    ;
  }
  ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                       ((CBlockIndex **)&pblocktemplate,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                        ,0x1eb,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
  pCVar21 = *ppCVar18;
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = CheckFinalTxAtTip(pCVar21,(CTransaction *)local_168);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,!bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bba63;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_810 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_818,0x1eb);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x1ec;
  file_25.m_begin = (iterator)&local_828;
  msg_25.m_end = pvVar25;
  msg_25.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_838,
             msg_25);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )((long)"!TestSequenceLocks(CTransaction{tx}, tx_mempool)" + 1);
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_840 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_848,0x1ec);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x1ed;
  file_26.m_begin = (iterator)&local_858;
  msg_26.m_end = pvVar25;
  msg_26.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_868,
             msg_26);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar26 = (pCVar14->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->nHeight;
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar19 = CBlockIndex::GetMedianTimePast
                     ((pCVar14->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]);
  bVar27 = IsFinalTx((CTransaction *)local_168,iVar26 + 2,iVar19 + 1);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bba6f;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_870 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_878,0x1ed);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (((tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  *prevheights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]->nHeight + 1;
  tx.nLockTime = 0;
  (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  )->nSequence = 0;
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x1f4;
  file_27.m_begin = (iterator)&local_888;
  msg_27.m_end = pvVar25;
  msg_27.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_898,
             msg_27);
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
          )(__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  }
  else {
    pblocktemplate._M_t.
    super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         *(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
           *)&((tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_> *)
              (ppCVar4 + -1))->
              super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
    ;
  }
  ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                       ((CBlockIndex **)&pblocktemplate,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                        ,500,"TestBasicMining","m_node.chainman->ActiveChain().Tip()");
  pCVar21 = *ppCVar18;
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = CheckFinalTxAtTip(pCVar21,(CTransaction *)local_168);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bba87;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_8a0 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_8a8,500);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x1f5;
  file_28.m_begin = (iterator)&local_8b8;
  msg_28.m_end = pvVar25;
  msg_28.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_8c8,
             msg_28);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )((long)"!TestSequenceLocks(CTransaction{tx}, tx_mempool)" + 1);
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_8d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_8d0 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_8d8,0x1f5);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  )->nSequence = 1;
  local_8e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x1f7;
  file_29.m_begin = (iterator)&local_8e8;
  msg_29.m_end = pvVar25;
  msg_29.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_8f8,
             msg_29);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,!bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb9b9;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_900 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_908,0x1f7);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  )->nSequence = 0x400000;
  local_918 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x1f9;
  file_30.m_begin = (iterator)&local_918;
  msg_30.m_end = pvVar25;
  msg_30.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_928,
             msg_30);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )((long)"!TestSequenceLocks(CTransaction{tx}, tx_mempool)" + 1);
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_938 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_930 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,_cVar28,
             (size_t)&local_938,0x1f9);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  (tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  )->nSequence = 0x400001;
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x1fb;
  file_31.m_begin = (iterator)&local_948;
  msg_31.m_end = pvVar25;
  msg_31.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_958,
             msg_31);
  CTransaction::CTransaction((CTransaction *)local_168,&tx);
  bVar27 = TestSequenceLocks(this,(CTransaction *)local_168,pCVar11);
  ar = (CTxMemPool *)&criticalblock12;
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,!bVar27);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bb9b9;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_968 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_960 = (Chainstate *)0xbb43f0;
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)ar,(lazy_ostream *)&script,1,0,WARN,_cVar28,(size_t)&local_968,
             0x1fb);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  CTransaction::~CTransaction((CTransaction *)local_168);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&pblocktemplate,(CScript *)local_168);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_978 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_970 = (CChainParams *)0xbb43f0;
  local_988 = (__node_base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x1fe;
  file_32.m_begin = (iterator)&local_978;
  msg_32.m_end = pvVar25;
  msg_32.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_988,
             msg_32);
  script.super_CScriptBase._union.direct[0] =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
       pblocktemplate._M_t.
       super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
       super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  script.super_CScriptBase._union._8_8_ = 0;
  script.super_CScriptBase._union._16_8_ = 0;
  criticalblock12.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_8bb86f;
  criticalblock12.super_unique_lock._8_8_ = (long)"pblocktemplate" + 0xe;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_998 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_990 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  apcStack_150[0] = (char *)ar;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&script,(lazy_ostream *)local_168,1,0,WARN,_cVar28,
             (size_t)&local_998,0x1fe);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&script.super_CScriptBase._union + 0x10));
  local_9f0._72_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_9f0._80_8_ = "";
  local_9f0._56_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0._64_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x204;
  file_33.m_begin = local_9f0 + 0x48;
  msg_33.m_end = pvVar25;
  msg_33.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,
             (size_t)(local_9f0 + 0x38),msg_33);
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  apcStack_150[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_9f0._40_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_9f0._48_8_ = "";
  script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)(*(long *)((long)pblocktemplate._M_t.
                                super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl +
                         0x58) -
                *(long *)((long)pblocktemplate._M_t.
                                super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl +
                         0x50) >> 4);
  pCVar12 = &script;
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock12.super_unique_lock._M_device._4_4_,3);
  pcVar24 = (char *)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,local_9f0 + 0x28,0x204,1,2,pCVar12,"pblocktemplate->block.vtx.size()",ar,"3U"
            );
  for (iVar26 = 0; iVar26 != -0xb; iVar26 = iVar26 + -1) {
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar4 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar4 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar21 = (CBlockIndex *)0x0;
    }
    else {
      pCVar21 = ppCVar4[-1];
    }
    pCVar14 = ChainstateManager::ActiveChainstate
                        ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                         m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    local_168._0_8_ =
         CBlockIndex::GetAncestor
                   (pCVar21,(pCVar14->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1]->nHeight + iVar26);
    pcVar24 = 
    "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
    ;
    ppCVar18 = inline_assertion_check<true,CBlockIndex*>
                         ((CBlockIndex **)local_168,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
                          ,0x207,"TestBasicMining",
                          "m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)"
                         );
    (*ppCVar18)->nTime = (*ppCVar18)->nTime + 0x200;
  }
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  piVar1 = &(pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->nHeight;
  *piVar1 = *piVar1 + 1;
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                       m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  iVar19 = CBlockIndex::GetMedianTimePast
                     ((pCVar14->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1]);
  SetMockTime(iVar19 + 1);
  local_9f0._24_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
  ;
  local_9f0._32_8_ = "";
  local_9f0._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x20d;
  file_34.m_begin = local_9f0 + 0x18;
  msg_34.m_end = (iterator)pCVar12;
  msg_34.m_begin = pcVar24;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)(local_9f0 + 8),
             msg_34);
  AssemblerForTest((BlockAssembler *)local_168,this,pCVar11);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_9f0,(CScript *)local_168);
  uVar22 = local_9f0._0_8_;
  local_9f0._0_8_ =
       (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0;
  std::__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::reset
            ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             &pblocktemplate,(pointer)uVar22);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)
       CONCAT71(criticalblock12.super_unique_lock._M_device._1_7_,
                (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
                pblocktemplate._M_t.
                super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                ._M_t.
                super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
                0x0);
  criticalblock12.super_unique_lock._M_owns = false;
  criticalblock12.super_unique_lock._9_7_ = 0;
  asStack_1b8[0].pi_ = (sp_counted_base *)0x0;
  pblocktemplate_1._M_t.
  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
       )anon_var_dwarf_8bba9f;
  script.super_CScriptBase._union._8_8_ = script.super_CScriptBase._union._8_8_ & 0xffffffffffffff00
  ;
  script.super_CScriptBase._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011481f0;
  script.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  script.super_CScriptBase._24_8_ = &pblocktemplate_1;
  local_a00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_9f8 = "";
  pvVar23 = &DAT_00000001;
  pvVar25 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock12,(lazy_ostream *)&script,1,0,WARN,(check_type)ar,
             (size_t)&local_a00,0x20d);
  boost::detail::shared_count::~shared_count(asStack_1b8);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             local_9f0);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)local_168);
  local_a10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x20e;
  file_35.m_begin = (iterator)&local_a10;
  msg_35.m_end = pvVar25;
  msg_35.m_begin = pvVar23;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_a20,
             msg_35);
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  apcStack_150[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_a30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_a28 = "";
  script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)(*(long *)((long)pblocktemplate._M_t.
                                super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl +
                         0x58) -
                *(long *)((long)pblocktemplate._M_t.
                                super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl +
                         0x50) >> 4);
  criticalblock12.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock12.super_unique_lock._M_device._4_4_,5);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_a30,0x20e,1,2,&script,"pblocktemplate->block.vtx.size()",
             (assertion_result *)&criticalblock12,"5U");
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&pblocktemplate);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&prevheights.super__Vector_base<int,_std::allocator<int>_>);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MinerTestingSetup::TestBasicMining(const CScript& scriptPubKey, const std::vector<CTransactionRef>& txFirst, int baseheight)
{
    Txid hash;
    CMutableTransaction tx;
    TestMemPoolEntryHelper entry;
    entry.nFee = 11;
    entry.nHeight = 11;

    const CAmount BLOCKSUBSIDY = 50 * COIN;
    const CAmount LOWFEE = CENT;
    const CAmount HIGHFEE = COIN;
    const CAmount HIGHERFEE = 4 * COIN;

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // Just to make sure we can still make simple blocks
        auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
        BOOST_CHECK(pblocktemplate);

        // block sigops > limit: 1000 CHECKMULTISIG + 1
        tx.vin.resize(1);
        // NOTE: OP_NOP is used to force 20 SigOps for the CHECKMULTISIG
        tx.vin[0].scriptSig = CScript() << OP_0 << OP_0 << OP_0 << OP_NOP << OP_CHECKMULTISIG << OP_1;
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vout.resize(1);
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 1001; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            // If we don't set the # of sig ops in the CTxMemPoolEntry, template creation fails
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }

        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-blk-sigops"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 1001; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            // If we do set the # of sig ops in the CTxMemPoolEntry, template creation passes
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).SigOpsCost(80).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // block size > limit
        tx.vin[0].scriptSig = CScript();
        // 18 * (520char + DROP) + OP_1 = 9433 bytes
        std::vector<unsigned char> vchData(520);
        for (unsigned int i = 0; i < 18; ++i) {
            tx.vin[0].scriptSig << vchData << OP_DROP;
        }
        tx.vin[0].scriptSig << OP_1;
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY;
        for (unsigned int i = 0; i < 128; ++i) {
            tx.vout[0].nValue -= LOWFEE;
            hash = tx.GetHash();
            bool spendsCoinbase = i == 0; // only first tx spends coinbase
            tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(spendsCoinbase).FromTx(tx));
            tx.vin[0].prevout.hash = hash;
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // orphan in tx_mempool, template creation fails
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).FromTx(tx));
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-txns-inputs-missingorspent"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // child with higher feerate than parent
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vin[0].prevout.hash = txFirst[1]->GetHash();
        tx.vout[0].nValue = BLOCKSUBSIDY - HIGHFEE;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vin[0].prevout.hash = hash;
        tx.vin.resize(2);
        tx.vin[1].scriptSig = CScript() << OP_1;
        tx.vin[1].prevout.hash = txFirst[0]->GetHash();
        tx.vin[1].prevout.n = 0;
        tx.vout[0].nValue = tx.vout[0].nValue + BLOCKSUBSIDY - HIGHERFEE; // First txn output + fresh coinbase - new txn fee
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHERFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // coinbase in tx_mempool, template creation fails
        tx.vin.resize(1);
        tx.vin[0].prevout.SetNull();
        tx.vin[0].scriptSig = CScript() << OP_0 << OP_1;
        tx.vout[0].nValue = 0;
        hash = tx.GetHash();
        // give it a fee so it'll get mined
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
        // Should throw bad-cb-multiple
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-cb-multiple"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // double spend txn pair in tx_mempool, template creation fails
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vout[0].nValue = BLOCKSUBSIDY - HIGHFEE;
        tx.vout[0].scriptPubKey = CScript() << OP_1;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vout[0].scriptPubKey = CScript() << OP_2;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("bad-txns-inputs-missingorspent"));
    }

    {
        CTxMemPool& tx_mempool{MakeMempool()};
        LOCK(tx_mempool.cs);

        // subsidy changing
        int nHeight = m_node.chainman->ActiveChain().Height();
        // Create an actual 209999-long block chain (without valid blocks).
        while (m_node.chainman->ActiveChain().Tip()->nHeight < 209999) {
            CBlockIndex* prev = m_node.chainman->ActiveChain().Tip();
            CBlockIndex* next = new CBlockIndex();
            next->phashBlock = new uint256(m_rng.rand256());
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(next->GetBlockHash());
            next->pprev = prev;
            next->nHeight = prev->nHeight + 1;
            next->BuildSkip();
            m_node.chainman->ActiveChain().SetTip(*next);
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
        // Extend to a 210000-long block chain.
        while (m_node.chainman->ActiveChain().Tip()->nHeight < 210000) {
            CBlockIndex* prev = m_node.chainman->ActiveChain().Tip();
            CBlockIndex* next = new CBlockIndex();
            next->phashBlock = new uint256(m_rng.rand256());
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(next->GetBlockHash());
            next->pprev = prev;
            next->nHeight = prev->nHeight + 1;
            next->BuildSkip();
            m_node.chainman->ActiveChain().SetTip(*next);
        }
        BOOST_CHECK(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));

        // invalid p2sh txn in tx_mempool, template creation fails
        tx.vin[0].prevout.hash = txFirst[0]->GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vin[0].scriptSig = CScript() << OP_1;
        tx.vout[0].nValue = BLOCKSUBSIDY - LOWFEE;
        CScript script = CScript() << OP_0;
        tx.vout[0].scriptPubKey = GetScriptForDestination(ScriptHash(script));
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
        tx.vin[0].prevout.hash = hash;
        tx.vin[0].scriptSig = CScript() << std::vector<unsigned char>(script.begin(), script.end());
        tx.vout[0].nValue -= LOWFEE;
        hash = tx.GetHash();
        tx_mempool.addUnchecked(entry.Fee(LOWFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
        // Should throw block-validation-failed
        BOOST_CHECK_EXCEPTION(AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey), std::runtime_error, HasReason("block-validation-failed"));

        // Delete the dummy blocks again.
        while (m_node.chainman->ActiveChain().Tip()->nHeight > nHeight) {
            CBlockIndex* del = m_node.chainman->ActiveChain().Tip();
            m_node.chainman->ActiveChain().SetTip(*Assert(del->pprev));
            m_node.chainman->ActiveChainstate().CoinsTip().SetBestBlock(del->pprev->GetBlockHash());
            delete del->phashBlock;
            delete del;
        }
    }

    CTxMemPool& tx_mempool{MakeMempool()};
    LOCK(tx_mempool.cs);

    // non-final txs in mempool
    SetMockTime(m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1);
    const int flags{LOCKTIME_VERIFY_SEQUENCE};
    // height map
    std::vector<int> prevheights;

    // relative height locked
    tx.version = 2;
    tx.vin.resize(1);
    prevheights.resize(1);
    tx.vin[0].prevout.hash = txFirst[0]->GetHash(); // only 1 transaction
    tx.vin[0].prevout.n = 0;
    tx.vin[0].scriptSig = CScript() << OP_1;
    tx.vin[0].nSequence = m_node.chainman->ActiveChain().Tip()->nHeight + 1; // txFirst[0] is the 2nd block
    prevheights[0] = baseheight + 1;
    tx.vout.resize(1);
    tx.vout[0].nValue = BLOCKSUBSIDY-HIGHFEE;
    tx.vout[0].scriptPubKey = CScript() << OP_1;
    tx.nLockTime = 0;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(HIGHFEE).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    {
        CBlockIndex* active_chain_tip = m_node.chainman->ActiveChain().Tip();
        BOOST_CHECK(SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 2, active_chain_tip))); // Sequence locks pass on 2nd block
    }

    // relative time locked
    tx.vin[0].prevout.hash = txFirst[1]->GetHash();
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG | (((m_node.chainman->ActiveChain().Tip()->GetMedianTimePast()+1-m_node.chainman->ActiveChain()[1]->GetMedianTimePast()) >> CTxIn::SEQUENCE_LOCKTIME_GRANULARITY) + 1); // txFirst[1] is the 3rd block
    prevheights[0] = baseheight + 2;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    const int SEQUENCE_LOCK_TIME = 512; // Sequence locks pass 512 seconds later
    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i)
        m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i)->nTime += SEQUENCE_LOCK_TIME; // Trick the MedianTimePast
    {
        CBlockIndex* active_chain_tip = m_node.chainman->ActiveChain().Tip();
        BOOST_CHECK(SequenceLocks(CTransaction(tx), flags, prevheights, *CreateBlockIndex(active_chain_tip->nHeight + 1, active_chain_tip)));
    }

    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i) {
        CBlockIndex* ancestor{Assert(m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i))};
        ancestor->nTime -= SEQUENCE_LOCK_TIME; // undo tricked MTP
    }

    // absolute height locked
    tx.vin[0].prevout.hash = txFirst[2]->GetHash();
    tx.vin[0].nSequence = CTxIn::MAX_SEQUENCE_NONFINAL;
    prevheights[0] = baseheight + 3;
    tx.nLockTime = m_node.chainman->ActiveChain().Tip()->nHeight + 1;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(!CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime fails
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    BOOST_CHECK(IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast())); // Locktime passes on 2nd block

    // absolute time locked
    tx.vin[0].prevout.hash = txFirst[3]->GetHash();
    tx.nLockTime = m_node.chainman->ActiveChain().Tip()->GetMedianTimePast();
    prevheights.resize(1);
    prevheights[0] = baseheight + 4;
    hash = tx.GetHash();
    tx_mempool.addUnchecked(entry.Time(Now<NodeSeconds>()).FromTx(tx));
    BOOST_CHECK(!CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime fails
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    BOOST_CHECK(IsFinalTx(CTransaction(tx), m_node.chainman->ActiveChain().Tip()->nHeight + 2, m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1)); // Locktime passes 1 second later

    // mempool-dependent transactions (not added)
    tx.vin[0].prevout.hash = hash;
    prevheights[0] = m_node.chainman->ActiveChain().Tip()->nHeight + 1;
    tx.nLockTime = 0;
    tx.vin[0].nSequence = 0;
    BOOST_CHECK(CheckFinalTxAtTip(*Assert(m_node.chainman->ActiveChain().Tip()), CTransaction{tx})); // Locktime passes
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    tx.vin[0].nSequence = 1;
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG;
    BOOST_CHECK(TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks pass
    tx.vin[0].nSequence = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG | 1;
    BOOST_CHECK(!TestSequenceLocks(CTransaction{tx}, tx_mempool)); // Sequence locks fail

    auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
    BOOST_CHECK(pblocktemplate);

    // None of the of the absolute height/time locked tx should have made
    // it into the template because we still check IsFinalTx in CreateNewBlock,
    // but relative locked txs will if inconsistently added to mempool.
    // For now these will still generate a valid template until BIP68 soft fork
    BOOST_CHECK_EQUAL(pblocktemplate->block.vtx.size(), 3U);
    // However if we advance height by 1 and time by SEQUENCE_LOCK_TIME, all of them should be mined
    for (int i = 0; i < CBlockIndex::nMedianTimeSpan; ++i) {
        CBlockIndex* ancestor{Assert(m_node.chainman->ActiveChain().Tip()->GetAncestor(m_node.chainman->ActiveChain().Tip()->nHeight - i))};
        ancestor->nTime += SEQUENCE_LOCK_TIME; // Trick the MedianTimePast
    }
    m_node.chainman->ActiveChain().Tip()->nHeight++;
    SetMockTime(m_node.chainman->ActiveChain().Tip()->GetMedianTimePast() + 1);

    BOOST_CHECK(pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey));
    BOOST_CHECK_EQUAL(pblocktemplate->block.vtx.size(), 5U);
}